

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O0

VariablePtr __thiscall
libcellml::AnalyserExternalVariable::dependency
          (AnalyserExternalVariable *this,ModelPtr *model,string *componentName,string *variableName
          )

{
  bool bVar1;
  reference psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  string *in_R8;
  VariablePtr VVar4;
  __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_38;
  iterator result;
  string *variableName_local;
  string *componentName_local;
  ModelPtr *model_local;
  AnalyserExternalVariable *this_local;
  
  local_38._M_current =
       (shared_ptr<libcellml::Variable> *)
       AnalyserExternalVariableImpl::findDependency
                 ((AnalyserExternalVariableImpl *)
                  (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                  (ModelPtr *)componentName,variableName,in_R8);
  local_40._M_current =
       (shared_ptr<libcellml::Variable> *)
       std::
       vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
       ::end((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
              *)&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->super_enable_shared_from_this<libcellml::Model>);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
  if (bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
             ::operator*(&local_38);
    std::shared_ptr<libcellml::Variable>::shared_ptr((shared_ptr<libcellml::Variable> *)this,psVar2)
    ;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<libcellml::Variable>::shared_ptr
              ((shared_ptr<libcellml::Variable> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX_00;
  }
  VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr AnalyserExternalVariable::dependency(const ModelPtr &model,
                                                 const std::string &componentName,
                                                 const std::string &variableName) const
{
    auto result = mPimpl->findDependency(model, componentName, variableName);

    return (result != mPimpl->mDependencies.end()) ?
               *result :
               nullptr;
}